

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnStream.cpp
# Opt level: O2

bool __thiscall
tfs::OutDnnStream::writeArray(OutDnnStream *this,unsigned_long *array,unsigned_long count)

{
  bool bVar1;
  ssize_t sVar2;
  size_t in_RCX;
  unsigned_long line;
  void *__buf;
  void *__buf_00;
  char *format;
  
  sVar2 = OutBinaryStream::write(&this->super_OutBinaryStream,4,(void *)count,in_RCX);
  if ((char)sVar2 == '\0') {
    format = "Unable to write matrix";
    line = 0xa8;
  }
  else {
    sVar2 = OutBinaryStream::write
                      (&this->super_OutBinaryStream,(uint)(array == (unsigned_long *)0x0),__buf,
                       in_RCX);
    if ((char)sVar2 == '\0') {
      format = "Unable to write array null / not null boolean";
      line = 0xac;
    }
    else {
      if (array == (unsigned_long *)0x0) {
        return true;
      }
      sVar2 = OutBinaryStream::write(&this->super_OutBinaryStream,(int)count,__buf_00,in_RCX);
      if ((char)sVar2 != '\0') {
        sVar2 = OutBinaryStream::write(&this->super_OutBinaryStream,(int)array,(void *)count,in_RCX)
        ;
        return SUB81(sVar2,0);
      }
      format = "Unable to write array count";
      line = 0xb2;
    }
  }
  bVar1 = report_problem("Error",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnStream.cpp"
                         ,"writeArray",line,format);
  return bVar1;
}

Assistant:

bool
    OutDnnStream::writeArray( const unsigned long *array, const unsigned long count ) {
        if( !write( OBJECT_ARRAY_UNSIGNED_LONG )) {
            return log_error( "Unable to write matrix" );
        }
        const bool arrayIsNull = array == 0;
        if( !write( arrayIsNull )) {
            return log_error( "Unable to write array null / not null boolean" );
        }
        if( arrayIsNull ) {
            return true;            // Our work here is done.
        }
        if( !write( count )) {
            return log_error( "Unable to write array count" );
        }
        return write( array, count );
    }